

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

target_ulong helper_sraw_ppc64(CPUPPCState_conflict2 *env,target_ulong value,target_ulong shift)

{
  byte bVar1;
  bool bVar2;
  int local_24;
  int32_t ret;
  target_ulong shift_local;
  target_ulong value_local;
  CPUPPCState_conflict2 *env_local;
  
  local_24 = (int)value;
  if ((shift & 0x20) == 0) {
    if ((int)shift == 0) {
      env->ca = 0;
      env->ca32 = 0;
    }
    else {
      bVar1 = (byte)shift & 0x1f;
      local_24 = local_24 >> bVar1;
      bVar2 = true;
      if (local_24 < 0) {
        bVar2 = (value & (long)((1 << bVar1) + -1)) == 0;
      }
      if (bVar2) {
        env->ca = 0;
        env->ca32 = 0;
      }
      else {
        env->ca = 1;
        env->ca32 = 1;
      }
    }
  }
  else {
    env->ca = (long)(int)(uint)(local_24 < 0);
    env->ca32 = (long)(int)(uint)(local_24 < 0);
    local_24 = local_24 >> 0x1f;
  }
  return (long)local_24;
}

Assistant:

target_ulong helper_sraw(CPUPPCState *env, target_ulong value,
                         target_ulong shift)
{
    int32_t ret;

    if (likely(!(shift & 0x20))) {
        if (likely((uint32_t)shift != 0)) {
            shift &= 0x1f;
            ret = (int32_t)value >> shift;
            if (likely(ret >= 0 || (value & ((1 << shift) - 1)) == 0)) {
                env->ca32 = env->ca = 0;
            } else {
                env->ca32 = env->ca = 1;
            }
        } else {
            ret = (int32_t)value;
            env->ca32 = env->ca = 0;
        }
    } else {
        ret = (int32_t)value >> 31;
        env->ca32 = env->ca = (ret != 0);
    }
    return (target_long)ret;
}